

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_dr_wav_uninit(ma_dr_wav *pWav)

{
  ma_dr_wav_container mVar1;
  ma_dr_wav_seek_proc p_Var2;
  ma_uint64 mVar3;
  _func_void_void_ptr_void_ptr *p_Var4;
  ma_bool32 mVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ma_result mVar10;
  void *pvVar11;
  ma_uint64 paddingData;
  ulong local_20;
  
  if (pWav == (ma_dr_wav *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pWav->onWrite == (ma_dr_wav_write_proc)0x0) {
    mVar10 = MA_SUCCESS;
    if ((pWav->pMetadata != (ma_dr_wav_metadata *)0x0) &&
       (p_Var4 = (pWav->allocationCallbacks).onFree, mVar10 = MA_SUCCESS,
       p_Var4 != (_func_void_void_ptr_void_ptr *)0x0)) {
      (*p_Var4)(pWav->pMetadata,(pWav->allocationCallbacks).pUserData);
    }
    goto LAB_0016976f;
  }
  uVar9 = 7;
  if (pWav->container == ma_dr_wav_container_rf64) {
    uVar9 = 1;
  }
  if (pWav->container == ma_dr_wav_container_riff) {
    uVar9 = 1;
  }
  uVar9 = uVar9 & (uint)pWav->dataChunkDataSize;
  if (uVar9 != 0) {
    local_20 = 0;
    (*pWav->onWrite)(pWav->pUserData,&local_20,(size_t)uVar9);
  }
  p_Var2 = pWav->onSeek;
  if ((p_Var2 != (ma_dr_wav_seek_proc)0x0) && (pWav->isSequentialWrite == 0)) {
    mVar1 = pWav->container;
    if (mVar1 == ma_dr_wav_container_rf64) {
      mVar5 = (*p_Var2)(pWav->pUserData,0x14,ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        mVar3 = pWav->dataChunkDataSize;
        sVar6 = ma_dr_wav__write_or_count_metadata
                          ((ma_dr_wav *)0x0,pWav->pMetadata,pWav->metadataCount);
        uVar8 = sVar6 + ((uint)mVar3 & 1) + mVar3 + 0x48;
        local_20 = 0xffffffff;
        if (uVar8 < 0xffffffff) {
          local_20 = uVar8;
        }
        (*pWav->onWrite)(pWav->pUserData,&local_20,8);
      }
      mVar5 = (*pWav->onSeek)(pWav->pUserData,0x1c,ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        local_20 = pWav->dataChunkDataSize;
LAB_00169736:
        pvVar11 = pWav->pUserData;
        sVar6 = 8;
LAB_00169747:
        (*pWav->onWrite)(pvVar11,&local_20,sVar6);
      }
    }
    else if (mVar1 == ma_dr_wav_container_w64) {
      mVar5 = (*p_Var2)(pWav->pUserData,0x10,ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        local_20 = pWav->dataChunkDataSize + (ulong)((uint)pWav->dataChunkDataSize & 7) + 0x68;
        (*pWav->onWrite)(pWav->pUserData,&local_20,8);
      }
      mVar5 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + -8,
                              ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        local_20 = pWav->dataChunkDataSize + 0x18;
        goto LAB_00169736;
      }
    }
    else if (mVar1 == ma_dr_wav_container_riff) {
      mVar5 = (*p_Var2)(pWav->pUserData,4,ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        mVar3 = pWav->dataChunkDataSize;
        sVar6 = ma_dr_wav__write_or_count_metadata
                          ((ma_dr_wav *)0x0,pWav->pMetadata,pWav->metadataCount);
        uVar7 = sVar6 + ((uint)mVar3 & 1) + mVar3 + 0x24;
        uVar8 = 0xffffffff;
        if (uVar7 < 0xffffffff) {
          uVar8 = uVar7;
        }
        local_20 = CONCAT44(local_20._4_4_,(int)uVar8);
        (*pWav->onWrite)(pWav->pUserData,&local_20,4);
      }
      mVar5 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos + -4,
                              ma_dr_wav_seek_origin_start);
      if (mVar5 != 0) {
        local_20 = CONCAT44(local_20._4_4_,
                            -(uint)(pWav->dataChunkDataSize >> 0x20 != 0) |
                            (uint)pWav->dataChunkDataSize);
        pvVar11 = pWav->pUserData;
        sVar6 = 4;
        goto LAB_00169747;
      }
    }
  }
  if (pWav->isSequentialWrite == 0) {
    mVar10 = MA_SUCCESS;
  }
  else {
    mVar10 = MA_INVALID_FILE;
    if (pWav->dataChunkDataSize == pWav->dataChunkDataSizeTargetWrite) {
      mVar10 = MA_SUCCESS;
    }
  }
LAB_0016976f:
  if ((pWav->onRead == ma_dr_wav__on_read_stdio) || (pWav->onWrite == ma_dr_wav__on_write_stdio)) {
    fclose((FILE *)pWav->pUserData);
  }
  return mVar10;
}

Assistant:

MA_API ma_result ma_dr_wav_uninit(ma_dr_wav* pWav)
{
    ma_result result = MA_SUCCESS;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    if (pWav->onWrite != NULL) {
        ma_uint32 paddingSize = 0;
        if (pWav->container == ma_dr_wav_container_riff || pWav->container == ma_dr_wav_container_rf64) {
            paddingSize = ma_dr_wav__chunk_padding_size_riff(pWav->dataChunkDataSize);
        } else {
            paddingSize = ma_dr_wav__chunk_padding_size_w64(pWav->dataChunkDataSize);
        }
        if (paddingSize > 0) {
            ma_uint64 paddingData = 0;
            ma_dr_wav__write(pWav, &paddingData, paddingSize);
        }
        if (pWav->onSeek && !pWav->isSequentialWrite) {
            if (pWav->container == ma_dr_wav_container_riff) {
                if (pWav->onSeek(pWav->pUserData, 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 riffChunkSize = ma_dr_wav__riff_chunk_size_riff(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u32ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 dataChunkSize = ma_dr_wav__data_chunk_size_riff(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u32ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_w64) {
                if (pWav->onSeek(pWav->pUserData, 16, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_rf64) {
                int ds64BodyPos = 12 + 8;
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 0, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_rf64(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_rf64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            }
        }
        if (pWav->isSequentialWrite) {
            if (pWav->dataChunkDataSize != pWav->dataChunkDataSizeTargetWrite) {
                result = MA_INVALID_FILE;
            }
        }
    } else {
        ma_dr_wav_free(pWav->pMetadata, &pWav->allocationCallbacks);
    }
#ifndef MA_DR_WAV_NO_STDIO
    if (pWav->onRead == ma_dr_wav__on_read_stdio || pWav->onWrite == ma_dr_wav__on_write_stdio) {
        fclose((FILE*)pWav->pUserData);
    }
#endif
    return result;
}